

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_attr(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  uint64_t *puVar1;
  exr_result_t eVar2;
  exr_attribute_t *a_00;
  undefined4 *puVar3;
  int32_t isz;
  undefined4 local_24 [3];
  
  puVar1 = &ctxt->output_file_offset;
  eVar2 = (*ctxt->do_write)(ctxt,a->name,(ulong)a->name_length + 1,puVar1);
  if (eVar2 == 0) {
    a_00 = (exr_attribute_t *)a->type_name;
    eVar2 = (*ctxt->do_write)(ctxt,a_00,(ulong)a->type_name_length + 1,puVar1);
    if (eVar2 == 0) {
      switch(a->type) {
      case EXR_ATTR_BOX2I:
        eVar2 = save_box2i(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_BOX2F:
        eVar2 = save_box2f(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_CHLIST:
        eVar2 = save_chlist(ctxt,a);
        return eVar2;
      case EXR_ATTR_CHROMATICITIES:
        eVar2 = save_chromaticities(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_COMPRESSION:
        puVar3 = local_24;
        break;
      case EXR_ATTR_DOUBLE:
        eVar2 = save_attr_double(ctxt,a_00);
        return eVar2;
      case EXR_ATTR_ENVMAP:
        puVar3 = local_24 + 1;
        break;
      case EXR_ATTR_FLOAT:
        eVar2 = save_attr_float(ctxt,a_00);
        return eVar2;
      case EXR_ATTR_FLOAT_VECTOR:
        eVar2 = save_float_vector(ctxt,a);
        return eVar2;
      case EXR_ATTR_INT:
        eVar2 = save_attr_int(ctxt,(exr_attribute_t *)(ulong)(uint)(a->field_6).i);
        return eVar2;
      case EXR_ATTR_KEYCODE:
        eVar2 = save_keycode(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_LINEORDER:
        puVar3 = local_24 + 2;
        break;
      case EXR_ATTR_M33F:
        eVar2 = save_m33f(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_M33D:
        eVar2 = save_m33d(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_M44F:
        eVar2 = save_m44f(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_M44D:
        eVar2 = save_m44d(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_PREVIEW:
        eVar2 = save_preview(ctxt,a);
        return eVar2;
      case EXR_ATTR_RATIONAL:
        eVar2 = save_rational(ctxt,(exr_attribute_t *)(((a->field_6).box2i)->min).field_0);
        return eVar2;
      case EXR_ATTR_STRING:
        eVar2 = save_string(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_STRING_VECTOR:
        eVar2 = save_string_vector(ctxt,a);
        return eVar2;
      case EXR_ATTR_TILEDESC:
        eVar2 = save_tiledesc(ctxt,a);
        return eVar2;
      case EXR_ATTR_TIMECODE:
        eVar2 = save_timecode(ctxt,(exr_attribute_t *)(((a->field_6).box2i)->min).field_0);
        return eVar2;
      case EXR_ATTR_V2I:
        eVar2 = save_v2i(ctxt,(exr_attribute_t *)(((a->field_6).box2i)->min).field_0);
        return eVar2;
      case EXR_ATTR_V2F:
        eVar2 = save_v2f(ctxt,(exr_attribute_t *)(((a->field_6).box2i)->min).field_0);
        return eVar2;
      case EXR_ATTR_V2D:
        eVar2 = save_v2d(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_V3I:
        eVar2 = save_v3i(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_V3F:
        eVar2 = save_v3f(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_V3D:
        eVar2 = save_v3d(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      case EXR_ATTR_OPAQUE:
        eVar2 = save_opaque(ctxt,(exr_attribute_t *)(a->field_6).box2i);
        return eVar2;
      default:
        eVar2 = (*ctxt->standard_error)(ctxt,0xe);
        return eVar2;
      }
      *puVar3 = 1;
      eVar2 = (*ctxt->do_write)(ctxt,puVar3,4,puVar1);
      if (eVar2 == 0) {
        eVar2 = (*ctxt->do_write)(ctxt,&a->field_6,1,puVar1);
      }
    }
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_attr (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv = ctxt->do_write (
        ctxt, a->name, a->name_length + 1, &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = ctxt->do_write (
        ctxt,
        a->type_name,
        a->type_name_length + 1,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    switch (a->type)
    {
        case EXR_ATTR_BOX2I: rv = save_box2i (ctxt, a); break;
        case EXR_ATTR_BOX2F: rv = save_box2f (ctxt, a); break;
        case EXR_ATTR_CHLIST: rv = save_chlist (ctxt, a); break;
        case EXR_ATTR_CHROMATICITIES: rv = save_chromaticities (ctxt, a); break;
        case EXR_ATTR_COMPRESSION: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_DOUBLE: rv = save_attr_double (ctxt, a); break;
        case EXR_ATTR_ENVMAP: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_FLOAT: rv = save_attr_float (ctxt, a); break;
        case EXR_ATTR_FLOAT_VECTOR: rv = save_float_vector (ctxt, a); break;
        case EXR_ATTR_INT: rv = save_attr_int (ctxt, a); break;
        case EXR_ATTR_KEYCODE: rv = save_keycode (ctxt, a); break;
        case EXR_ATTR_LINEORDER: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_M33F: rv = save_m33f (ctxt, a); break;
        case EXR_ATTR_M33D: rv = save_m33d (ctxt, a); break;
        case EXR_ATTR_M44F: rv = save_m44f (ctxt, a); break;
        case EXR_ATTR_M44D: rv = save_m44d (ctxt, a); break;
        case EXR_ATTR_PREVIEW: rv = save_preview (ctxt, a); break;
        case EXR_ATTR_RATIONAL: rv = save_rational (ctxt, a); break;
        case EXR_ATTR_STRING: rv = save_string (ctxt, a); break;
        case EXR_ATTR_STRING_VECTOR: rv = save_string_vector (ctxt, a); break;
        case EXR_ATTR_TILEDESC: rv = save_tiledesc (ctxt, a); break;
        case EXR_ATTR_TIMECODE: rv = save_timecode (ctxt, a); break;
        case EXR_ATTR_V2I: rv = save_v2i (ctxt, a); break;
        case EXR_ATTR_V2F: rv = save_v2f (ctxt, a); break;
        case EXR_ATTR_V2D: rv = save_v2d (ctxt, a); break;
        case EXR_ATTR_V3I: rv = save_v3i (ctxt, a); break;
        case EXR_ATTR_V3F: rv = save_v3f (ctxt, a); break;
        case EXR_ATTR_V3D: rv = save_v3d (ctxt, a); break;
        case EXR_ATTR_OPAQUE: rv = save_opaque (ctxt, a); break;

        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: rv = ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR); break;
    }
    return rv;
}